

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

Lit_t __thiscall Potassco::SmodelsConvert::get(SmodelsConvert *this,Lit_t in)

{
  uint uVar1;
  Atom *pAVar2;
  Atom_t a;
  
  a = -in;
  if (0 < in) {
    a = in;
  }
  pAVar2 = SmData::mapAtom(this->data_,a);
  uVar1 = -((uint)*pAVar2 & 0xfffffff);
  if (-1 < in) {
    uVar1 = (uint)*pAVar2 & 0xfffffff;
  }
  return uVar1;
}

Assistant:

Lit_t SmodelsConvert::get(Lit_t in) const {
	return data_->mapLit(in);
}